

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thread.cpp
# Opt level: O0

void __thiscall higan::Thread::~Thread(Thread *this)

{
  LogLevel LVar1;
  undefined8 uVar2;
  Fmt local_328;
  Logger local_228;
  Thread *local_10;
  Thread *this_local;
  
  local_10 = this;
  if (((this->started & 1U) != 0) && ((this->joined & 1U) == 0)) {
    LVar1 = Logger::GetLogLevel();
    if ((int)LVar1 < 2) {
      Logger::Logger(&local_228,INFO,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/HiganFish[P]higan/higan/base/Thread.cpp"
                     ,0x37,"~Thread");
      uVar2 = std::__cxx11::string::c_str();
      Fmt::Fmt(&local_328,"detach thread: %s",uVar2);
      Logger::operator<<(&local_228,&local_328);
      Logger::~Logger(&local_228);
    }
    pthread_detach(this->thread_);
  }
  std::function<void_()>::~function(&this->function_);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

Thread::~Thread()
{
	/**
	 * 当线程未已经启动且未被Join detach线程继续运行 否则直接退出
	 */
	if (started && !joined)
	{
		LOG_INFO << higan::Fmt("detach thread: %s", name_.c_str());
		pthread_detach(thread_);
	}
}